

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

void Curl_sasl_init(SASL *sasl,Curl_easy *data,SASLproto *params)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  
  uVar1 = (data->set).httpauth;
  sasl->params = params;
  sasl->state = SASL_STOP;
  sasl->curmech = (char *)0x0;
  sasl->authmechs = 0;
  sasl->prefmech = params->defmechs;
  sasl->authused = 0;
  sasl->field_0x1e = (sasl->field_0x1e & 0xf8) + 1;
  if (uVar1 != 1) {
    uVar4 = (ushort)uVar1 * 4;
    uVar2 = uVar4 & 8 | (ushort)((uVar1 & 1) != 0) * 3;
    uVar3 = (ushort)uVar1 & 8;
    uVar5 = uVar2 + 0x180 + uVar3 * 8;
    if ((uVar1 & 0x40) == 0) {
      uVar5 = uVar2 + uVar3 * 8;
    }
    uVar5 = uVar4 & 0x10 | uVar5;
    if (uVar5 != 0) {
      sasl->prefmech = uVar5;
    }
  }
  return;
}

Assistant:

void Curl_sasl_init(struct SASL *sasl, struct Curl_easy *data,
                    const struct SASLproto *params)
{
  unsigned long auth = data->set.httpauth;

  sasl->params = params;           /* Set protocol dependent parameters */
  sasl->state = SASL_STOP;         /* Not yet running */
  sasl->curmech = NULL;            /* No mechanism yet. */
  sasl->authmechs = SASL_AUTH_NONE; /* No known authentication mechanism yet */
  sasl->prefmech = params->defmechs; /* Default preferred mechanisms */
  sasl->authused = SASL_AUTH_NONE; /* The authentication mechanism used */
  sasl->resetprefs = TRUE;         /* Reset prefmech upon AUTH parsing. */
  sasl->mutual_auth = FALSE;       /* No mutual authentication (GSSAPI only) */
  sasl->force_ir = FALSE;          /* Respect external option */

  if(auth != CURLAUTH_BASIC) {
    unsigned short mechs = SASL_AUTH_NONE;

    /* If some usable http authentication options have been set, determine
       new defaults from them. */
    if(auth & CURLAUTH_BASIC)
      mechs |= SASL_MECH_PLAIN | SASL_MECH_LOGIN;
    if(auth & CURLAUTH_DIGEST)
      mechs |= SASL_MECH_DIGEST_MD5;
    if(auth & CURLAUTH_NTLM)
      mechs |= SASL_MECH_NTLM;
    if(auth & CURLAUTH_BEARER)
      mechs |= SASL_MECH_OAUTHBEARER | SASL_MECH_XOAUTH2;
    if(auth & CURLAUTH_GSSAPI)
      mechs |= SASL_MECH_GSSAPI;

    if(mechs != SASL_AUTH_NONE)
      sasl->prefmech = mechs;
  }
}